

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O0

void __thiscall
EVPTest_WycheproofECDSAP224_Test::~EVPTest_WycheproofECDSAP224_Test
          (EVPTest_WycheproofECDSAP224_Test *this)

{
  EVPTest_WycheproofECDSAP224_Test *this_local;
  
  ~EVPTest_WycheproofECDSAP224_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(EVPTest, WycheproofECDSAP224) {
  RunWycheproofVerifyTest(
      "third_party/wycheproof_testvectors/ecdsa_secp224r1_sha224_test.txt");
  RunWycheproofVerifyTest(
      "third_party/wycheproof_testvectors/ecdsa_secp224r1_sha256_test.txt");
  RunWycheproofVerifyTest(
      "third_party/wycheproof_testvectors/ecdsa_secp224r1_sha512_test.txt");
}